

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int UnixVfs_Stat(char *zPath,jx9_value *pArray,jx9_value *pWorker)

{
  int iVar1;
  stat st;
  
  iVar1 = stat(zPath,(stat *)&st);
  if (iVar1 == 0) {
    jx9_value_int64(pWorker,st.st_dev);
    jx9_array_add_strkey_elem(pArray,"dev",pWorker);
    jx9_value_int64(pWorker,st.st_ino);
    jx9_array_add_strkey_elem(pArray,"ino",pWorker);
    jx9_value_int(pWorker,st.st_mode);
    jx9_array_add_strkey_elem(pArray,"mode",pWorker);
    jx9_value_int(pWorker,(int)st.st_nlink);
    jx9_array_add_strkey_elem(pArray,"nlink",pWorker);
    jx9_value_int(pWorker,st.st_uid);
    jx9_array_add_strkey_elem(pArray,"uid",pWorker);
    jx9_value_int(pWorker,st.st_gid);
    jx9_array_add_strkey_elem(pArray,"gid",pWorker);
    jx9_value_int(pWorker,(int)st.st_rdev);
    jx9_array_add_strkey_elem(pArray,"rdev",pWorker);
    jx9_value_int64(pWorker,st.st_size);
    jx9_array_add_strkey_elem(pArray,"size",pWorker);
    jx9_value_int64(pWorker,st.st_atim.tv_sec);
    jx9_array_add_strkey_elem(pArray,"atime",pWorker);
    jx9_value_int64(pWorker,st.st_mtim.tv_sec);
    jx9_array_add_strkey_elem(pArray,"mtime",pWorker);
    jx9_value_int64(pWorker,st.st_ctim.tv_sec);
    jx9_array_add_strkey_elem(pArray,"ctime",pWorker);
    jx9_value_int(pWorker,(int)st.st_blksize);
    jx9_array_add_strkey_elem(pArray,"blksize",pWorker);
    jx9_value_int(pWorker,(int)st.st_blocks);
    jx9_array_add_strkey_elem(pArray,"blocks",pWorker);
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int UnixVfs_Stat(const char *zPath, jx9_value *pArray, jx9_value *pWorker)
{
	struct stat st;
	int rc;
	rc = stat(zPath, &st);
	if( rc != 0 ){ 
	 return -1;
	}
	/* dev */
	jx9_value_int64(pWorker, (jx9_int64)st.st_dev);
	jx9_array_add_strkey_elem(pArray, "dev", pWorker); /* Will make it's own copy */
	/* ino */
	jx9_value_int64(pWorker, (jx9_int64)st.st_ino);
	jx9_array_add_strkey_elem(pArray, "ino", pWorker); /* Will make it's own copy */
	/* mode */
	jx9_value_int(pWorker, (int)st.st_mode);
	jx9_array_add_strkey_elem(pArray, "mode", pWorker);
	/* nlink */
	jx9_value_int(pWorker, (int)st.st_nlink);
	jx9_array_add_strkey_elem(pArray, "nlink", pWorker); /* Will make it's own copy */
	/* uid, gid, rdev */
	jx9_value_int(pWorker, (int)st.st_uid);
	jx9_array_add_strkey_elem(pArray, "uid", pWorker);
	jx9_value_int(pWorker, (int)st.st_gid);
	jx9_array_add_strkey_elem(pArray, "gid", pWorker);
	jx9_value_int(pWorker, (int)st.st_rdev);
	jx9_array_add_strkey_elem(pArray, "rdev", pWorker);
	/* size */
	jx9_value_int64(pWorker, (jx9_int64)st.st_size);
	jx9_array_add_strkey_elem(pArray, "size", pWorker); /* Will make it's own copy */
	/* atime */
	jx9_value_int64(pWorker, (jx9_int64)st.st_atime);
	jx9_array_add_strkey_elem(pArray, "atime", pWorker); /* Will make it's own copy */
	/* mtime */
	jx9_value_int64(pWorker, (jx9_int64)st.st_mtime);
	jx9_array_add_strkey_elem(pArray, "mtime", pWorker); /* Will make it's own copy */
	/* ctime */
	jx9_value_int64(pWorker, (jx9_int64)st.st_ctime);
	jx9_array_add_strkey_elem(pArray, "ctime", pWorker); /* Will make it's own copy */
	/* blksize, blocks */
	jx9_value_int(pWorker, (int)st.st_blksize);		
	jx9_array_add_strkey_elem(pArray, "blksize", pWorker);
	jx9_value_int(pWorker, (int)st.st_blocks);
	jx9_array_add_strkey_elem(pArray, "blocks", pWorker);
	return JX9_OK;
}